

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O0

void SL::WS_LITE::
     write<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>,SL::WS_LITE::WSMessage>
               (shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *socket,WSMessage *msg)

{
  uchar val;
  bool bVar1;
  unsigned_short val_00;
  unsigned_long_long val_01;
  element_type *peVar2;
  element_type *peVar3;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  mutable_buffer local_60;
  size_t local_50;
  size_t bytes_transferred;
  error_code ec;
  uchar local_2a [8];
  uchar header [10];
  size_t sendsize;
  WSMessage *msg_local;
  shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
  *socket_local;
  
  header[2] = '\0';
  header[3] = '\0';
  header[4] = '\0';
  header[5] = '\0';
  header[6] = '\0';
  header[7] = '\0';
  header[8] = '\0';
  header[9] = '\0';
  memset(local_2a,0,10);
  setFin(local_2a,0xff);
  set_MaskBitForSending(local_2a,false);
  setOpCode(local_2a,msg->code);
  setrsv1(local_2a,'\0');
  setrsv2(local_2a,'\0');
  setrsv3(local_2a,'\0');
  if (msg->len < 0x7e) {
    val = hton<unsigned_char>((uchar)msg->len);
    setpayloadLength1(local_2a,val);
    header[2] = '\x02';
    header[3] = '\0';
    header[4] = '\0';
    header[5] = '\0';
    header[6] = '\0';
    header[7] = '\0';
    header[8] = '\0';
    header[9] = '\0';
  }
  else if (msg->len < 0x10000) {
    val_00 = hton<unsigned_short>((unsigned_short)msg->len);
    setpayloadLength2(local_2a,val_00);
    setpayloadLength1(local_2a,'~');
    header[2] = '\x04';
    header[3] = '\0';
    header[4] = '\0';
    header[5] = '\0';
    header[6] = '\0';
    header[7] = '\0';
    header[8] = '\0';
    header[9] = '\0';
  }
  else {
    val_01 = hton<unsigned_long_long>(msg->len);
    setpayloadLength8(local_2a,val_01);
    setpayloadLength1(local_2a,'\x7f');
    header[2] = '\n';
    header[3] = '\0';
    header[4] = '\0';
    header[5] = '\0';
    header[6] = '\0';
    header[7] = '\0';
    header[8] = '\0';
    header[9] = '\0';
  }
  if (0xfffffffe < msg->len) {
    __assert_fail("msg.len < UINT32_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
                  ,0x9e,
                  "void SL::WS_LITE::write(const SOCKETTYPE &, const SENDBUFFERTYPE &) [isServer = false, SOCKETTYPE = std::shared_ptr<SL::WS_LITE::WebSocket<false, asio::basic_stream_socket<asio::ip::tcp>>>, SENDBUFFERTYPE = SL::WS_LITE::WSMessage]"
                 );
  }
  peVar2 = std::
           __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)socket);
  peVar3 = std::
           __shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&peVar2->Parent);
  ec._M_cat = (error_category *)(peVar3->WriteTimeout).__r;
  writeexpire_from_now<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
            (socket,(seconds)ec._M_cat);
  std::error_code::error_code((error_code *)&bytes_transferred);
  peVar2 = std::
           __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)socket);
  local_60 = (mutable_buffer)asio::buffer<unsigned_char,10ul>((uchar (*) [10])local_2a,header._2_8_)
  ;
  local_50 = asio::write<asio::basic_stream_socket<asio::ip::tcp>,asio::mutable_buffers_1>
                       (&peVar2->Socket,(mutable_buffers_1 *)&local_60,
                        (error_code *)&bytes_transferred,(type *)0x0);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&bytes_transferred);
  if (bVar1) {
    std::error_code::message_abi_cxx11_(&local_a0,(error_code *)&bytes_transferred);
    std::operator+(&local_80,"write header failed ",&local_a0);
    handleclose<std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
              (socket,0x3ea,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    if (header._2_8_ != local_50) {
      __assert_fail("sendsize == bytes_transferred",
                    "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
                    ,0xa4,
                    "void SL::WS_LITE::write(const SOCKETTYPE &, const SENDBUFFERTYPE &) [isServer = false, SOCKETTYPE = std::shared_ptr<SL::WS_LITE::WebSocket<false, asio::basic_stream_socket<asio::ip::tcp>>>, SENDBUFFERTYPE = SL::WS_LITE::WSMessage]"
                   );
    }
    writeend<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>,SL::WS_LITE::WSMessage>
              (socket,msg,false);
  }
  return;
}

Assistant:

inline void write(const SOCKETTYPE &socket, const SENDBUFFERTYPE &msg)
    {
        size_t sendsize = 0;
        unsigned char header[10] = {};

        setFin(header, 0xFF);
        set_MaskBitForSending(header, isServer);
        setOpCode(header, msg.code);
        setrsv1(header, 0x00);
        setrsv2(header, 0x00);
        setrsv3(header, 0x00);

        if (msg.len <= 125) {
            setpayloadLength1(header, hton(static_cast<unsigned char>(msg.len)));
            sendsize = 2;
        }
        else if (msg.len > USHRT_MAX) {
            setpayloadLength8(header, hton(static_cast<unsigned long long int>(msg.len)));
            setpayloadLength1(header, 127);
            sendsize = 10;
        }
        else {
            setpayloadLength2(header, hton(static_cast<unsigned short>(msg.len)));
            setpayloadLength1(header, 126);
            sendsize = 4;
        }

        assert(msg.len < UINT32_MAX);
        writeexpire_from_now<isServer>(socket, socket->Parent->WriteTimeout);
        std::error_code ec;
        auto bytes_transferred = asio::write(socket->Socket, asio::buffer(header, sendsize), ec);
        UNUSED(bytes_transferred);
        if (!ec) {
            assert(sendsize == bytes_transferred);
            writeend<isServer>(socket, msg, isServer);
        }
        else {
            handleclose(socket, 1002, "write header failed " + ec.message());
        }
    }